

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O1

UCalendarDateFields __thiscall
icu_63::Calendar::resolveFields(Calendar *this,UFieldResolutionTable *precedenceTable)

{
  int iVar1;
  UCalendarDateFields UVar2;
  UCalendarDateFields UVar3;
  long lVar4;
  int32_t *piVar5;
  int32_t *piVar6;
  int32_t *piVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  UCalendarDateFields UVar13;
  UCalendarDateFields UVar14;
  bool bVar15;
  
  if ((*precedenceTable)[0][0] == -1) {
    return UCAL_FIELD_COUNT;
  }
  piVar6 = (*precedenceTable)[0] + 1;
  lVar10 = 0;
  do {
    UVar13 = precedenceTable[lVar10][0][0];
    if (UVar13 == ~UCAL_ERA) {
      UVar3 = UCAL_FIELD_COUNT;
    }
    else {
      iVar8 = 0;
      piVar7 = piVar6;
      lVar12 = 0;
      UVar2 = UCAL_FIELD_COUNT;
      do {
        lVar4 = (long)precedenceTable[lVar10][lVar12][0x1f < (int)UVar13];
        bVar15 = lVar4 == -1;
        if (bVar15) {
          iVar9 = 0;
        }
        else {
          iVar11 = this->fStamp[lVar4];
          iVar9 = iVar11;
          if (iVar11 < 1) {
            iVar9 = 0;
          }
          if (iVar11 != 0) {
            piVar5 = piVar7 + (0x1f < (int)UVar13);
            iVar11 = iVar9;
            do {
              iVar9 = iVar11;
              bVar15 = (long)*piVar5 == -1;
              if (bVar15) break;
              iVar1 = this->fStamp[*piVar5];
              iVar11 = iVar9;
              if (iVar9 < iVar1) {
                iVar11 = iVar1;
              }
              piVar5 = piVar5 + 1;
            } while (iVar1 != 0);
          }
        }
        UVar3 = UVar2;
        if ((bVar15) && (iVar8 < iVar9)) {
          UVar3 = UVar13;
          if (0x1f < (int)UVar13) {
            UVar14 = UVar13 & (UCAL_DST_OFFSET|UCAL_ZONE_OFFSET);
            UVar13 = UCAL_DATE;
            UVar3 = UVar2;
            if (UVar14 != UCAL_DATE || this->fStamp[4] < this->fStamp[5]) {
              UVar13 = UVar14;
              UVar3 = UVar14;
            }
          }
          if (UVar3 == UVar13) {
            iVar8 = iVar9;
          }
        }
        UVar13 = precedenceTable[lVar10][lVar12 + 1][0];
        piVar7 = piVar7 + 8;
        lVar12 = lVar12 + 1;
        UVar2 = UVar3;
      } while (UVar13 != ~UCAL_ERA);
    }
    lVar10 = lVar10 + 1;
    if ((precedenceTable[lVar10][0][0] == -1) || (piVar6 = piVar6 + 0x60, UVar3 != UCAL_FIELD_COUNT)
       ) {
      return UVar3;
    }
  } while( true );
}

Assistant:

UCalendarDateFields Calendar::resolveFields(const UFieldResolutionTable* precedenceTable) {
    int32_t bestField = UCAL_FIELD_COUNT;
    int32_t tempBestField;
    for (int32_t g=0; precedenceTable[g][0][0] != -1 && (bestField == UCAL_FIELD_COUNT); ++g) {
        int32_t bestStamp = kUnset;
        for (int32_t l=0; precedenceTable[g][l][0] != -1; ++l) {
            int32_t lineStamp = kUnset;
            // Skip over first entry if it is negative
            for (int32_t i=((precedenceTable[g][l][0]>=kResolveRemap)?1:0); precedenceTable[g][l][i]!=-1; ++i) {
                U_ASSERT(precedenceTable[g][l][i] < UCAL_FIELD_COUNT);
                int32_t s = fStamp[precedenceTable[g][l][i]];
                // If any field is unset then don't use this line
                if (s == kUnset) {
                    goto linesInGroup;
                } else if(s > lineStamp) {
                    lineStamp = s;
                }
            }
            // Record new maximum stamp & field no.
            if (lineStamp > bestStamp) {
                tempBestField = precedenceTable[g][l][0]; // First field refers to entire line
                if (tempBestField >= kResolveRemap) {
                    tempBestField &= (kResolveRemap-1);
                    // This check is needed to resolve some issues with UCAL_YEAR precedence mapping
                    if (tempBestField != UCAL_DATE || (fStamp[UCAL_WEEK_OF_MONTH] < fStamp[tempBestField])) {
                        bestField = tempBestField;
                    }
                } else {
                    bestField = tempBestField;
                }

                if (bestField == tempBestField) {
                    bestStamp = lineStamp;
                }
            }
linesInGroup:
            ;
        }
    }
    return (UCalendarDateFields)bestField;
}